

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.c
# Opt level: O2

exr_result_t
exr_compress_buffer(int level,void *in,size_t in_bytes,void *out,size_t out_bytes_avail,
                   size_t *actual_out)

{
  long lVar1;
  size_t sVar2;
  exr_result_t eVar3;
  undefined4 in_register_0000003c;
  ulong uVar4;
  int level_local;
  size_t *local_38;
  
  uVar4 = CONCAT44(in_register_0000003c,level);
  level_local = level;
  local_38 = actual_out;
  if (level < 0) {
    exr_get_default_zip_compression_level(&level_local);
    uVar4 = (ulong)(uint)level_local;
    if (level_local < 0) {
      level_local = 4;
      uVar4 = 4;
    }
  }
  lVar1 = libdeflate_alloc_compressor(uVar4);
  eVar3 = 1;
  if (lVar1 != 0) {
    sVar2 = libdeflate_zlib_compress(lVar1,in,in_bytes,out,out_bytes_avail);
    libdeflate_free_compressor(lVar1);
    if (sVar2 != 0) {
      eVar3 = 0;
      if (local_38 != (size_t *)0x0) {
        *local_38 = sVar2;
      }
    }
  }
  return eVar3;
}

Assistant:

exr_result_t exr_compress_buffer (
    int level,
    const void *in,
    size_t in_bytes,
    void *out,
    size_t out_bytes_avail,
    size_t *actual_out )
{
    struct libdeflate_compressor *comp;

    if (level < 0)
    {
        exr_get_default_zip_compression_level (&level);
        /* truly unset anywhere */
        if (level < 0)
            level = EXR_DEFAULT_ZLIB_COMPRESS_LEVEL;
    }

    comp = libdeflate_alloc_compressor (level);
    if (comp)
    {
        size_t outsz;
        outsz = libdeflate_zlib_compress (
            comp,
            in,
            in_bytes,
            out,
            out_bytes_avail);

        libdeflate_free_compressor (comp);

        if (outsz != 0)
        {
            if (actual_out)
                *actual_out = outsz;
            return EXR_ERR_SUCCESS;
        }
        return EXR_ERR_OUT_OF_MEMORY;
    }
    return EXR_ERR_OUT_OF_MEMORY;
}